

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

uint8_t av1_get_txb_entropy_context(tran_low_t *qcoeff,SCAN_ORDER *scan_order,int eob)

{
  int iVar1;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  int iVar3;
  
  uVar2 = 0;
  if (eob != 0) {
    if (0 < eob) {
      uVar2 = 0;
      lVar6 = 0;
      do {
        iVar1 = qcoeff[scan_order->scan[lVar6]];
        iVar3 = -iVar1;
        if (0 < iVar1) {
          iVar3 = iVar1;
        }
        uVar2 = iVar3 + uVar2;
      } while ((uVar2 < 8) && (bVar7 = (ulong)(uint)eob - 1 != lVar6, lVar6 = lVar6 + 1, bVar7));
    }
    uVar4 = 7;
    if (uVar2 < 7) {
      uVar4 = uVar2;
    }
    uVar5 = (uint)(byte)((byte)uVar4 | 0x10);
    if (*qcoeff == 0) {
      uVar5 = uVar4;
    }
    uVar2 = (uint)(byte)((byte)uVar4 | 8);
    if (-1 < *qcoeff) {
      uVar2 = uVar5;
    }
  }
  return (uint8_t)uVar2;
}

Assistant:

uint8_t av1_get_txb_entropy_context(const tran_low_t *qcoeff,
                                    const SCAN_ORDER *scan_order, int eob) {
  const int16_t *const scan = scan_order->scan;
  int cul_level = 0;
  int c;

  if (eob == 0) return 0;
  for (c = 0; c < eob; ++c) {
    cul_level += abs(qcoeff[scan[c]]);
    if (cul_level > COEFF_CONTEXT_MASK) break;
  }

  cul_level = AOMMIN(COEFF_CONTEXT_MASK, cul_level);
  set_dc_sign(&cul_level, qcoeff[0]);

  return (uint8_t)cul_level;
}